

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_16x16(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  JSAMPROW pJVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  DCTELEM workspace [64];
  int *local_1c0;
  int local_138 [8];
  int aiStack_118 [8];
  int aiStack_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar18 = (ulong)start_col;
  lVar27 = 0;
  local_1c0 = data;
  do {
    pJVar17 = sample_data[lVar27];
    uVar35 = (ulong)((uint)pJVar17[uVar18] + (uint)pJVar17[uVar18 + 0xf]);
    uVar39 = (ulong)((uint)pJVar17[uVar18 + 1] + (uint)pJVar17[uVar18 + 0xe]);
    uVar34 = (ulong)((uint)pJVar17[uVar18 + 6] + (uint)pJVar17[uVar18 + 9]);
    uVar20 = (ulong)((uint)pJVar17[uVar18 + 7] + (uint)pJVar17[uVar18 + 8]);
    lVar25 = uVar20 + uVar35;
    lVar36 = uVar35 - uVar20;
    lVar26 = uVar34 + uVar39;
    lVar40 = uVar39 - uVar34;
    uVar34 = (ulong)((uint)pJVar17[uVar18 + 2] + (uint)pJVar17[uVar18 + 0xd]);
    uVar20 = (ulong)((uint)pJVar17[uVar18 + 5] + (uint)pJVar17[uVar18 + 10]);
    lVar28 = uVar20 + uVar34;
    lVar41 = uVar34 - uVar20;
    uVar20 = (ulong)((uint)pJVar17[uVar18 + 3] + (uint)pJVar17[uVar18 + 0xc]);
    uVar34 = (ulong)((uint)pJVar17[uVar18 + 4] + (uint)pJVar17[uVar18 + 0xb]);
    lVar30 = uVar34 + uVar20;
    lVar29 = uVar20 - uVar34;
    lVar37 = (ulong)pJVar17[uVar18] - (ulong)pJVar17[uVar18 + 0xf];
    lVar23 = (ulong)pJVar17[uVar18 + 1] - (ulong)pJVar17[uVar18 + 0xe];
    lVar32 = (ulong)pJVar17[uVar18 + 2] - (ulong)pJVar17[uVar18 + 0xd];
    lVar24 = (ulong)pJVar17[uVar18 + 3] - (ulong)pJVar17[uVar18 + 0xc];
    lVar21 = (ulong)pJVar17[uVar18 + 4] - (ulong)pJVar17[uVar18 + 0xb];
    lVar38 = (ulong)pJVar17[uVar18 + 5] - (ulong)pJVar17[uVar18 + 10];
    lVar31 = (ulong)pJVar17[uVar18 + 6] - (ulong)pJVar17[uVar18 + 9];
    lVar33 = (ulong)pJVar17[uVar18 + 7] - (ulong)pJVar17[uVar18 + 8];
    *local_1c0 = ((int)lVar25 + (int)lVar26 + (int)lVar28 + (int)lVar30) * 4 + -0x2000;
    local_1c0[4] = (int)((lVar26 - lVar28) * 0x1151 + (lVar25 - lVar30) * 0x29cf + 0x400U >> 0xb);
    lVar25 = (lVar36 - lVar41) * 0x2c63 + (lVar29 - lVar40) * 0x8d4;
    local_1c0[2] = (int)((ulong)(lVar41 * 0x4587 + lVar25 + 0x400 + lVar40 * 0x2e75) >> 0xb);
    local_1c0[6] = (int)((ulong)(lVar29 * 0x7ffffffde07 + lVar25 + 0x400 + lVar36 * 0x7fffffff93e)
                        >> 0xb);
    lVar28 = (lVar31 - lVar33) * 0xd23 + (lVar37 + lVar23) * 0x2b4e;
    lVar26 = (lVar33 + lVar38) * 0x1555 + (lVar32 + lVar37) * 0x27e9;
    lVar30 = (lVar21 - lVar33) * 0x1cb6 + (lVar24 + lVar37) * 0x22fc;
    lVar36 = (lVar31 - lVar38) * 0x2d09 + (lVar32 + lVar23) * 0x470;
    lVar25 = (lVar21 + lVar31) * -0x27e9 + (lVar24 + lVar23) * -0x1555;
    lVar29 = (lVar38 - lVar21) * 0xd23 + (lVar24 + lVar32) * -0x2b4e;
    local_1c0[1] = (int)(lVar33 * 0x18f3 + lVar37 * 0x7ffffffb6d6 + lVar26 + lVar28 + lVar30 +
                         0x400U >> 0xb);
    local_1c0[3] = (int)(lVar28 + lVar36 + lVar31 * 0x7ffffffcac1 + lVar23 * 0x24d + lVar25 + 0x400U
                        >> 0xb);
    local_1c0[5] = (int)((ulong)(lVar38 * 0x2747 + lVar36 + lVar32 * -0x2406 + lVar29 + 0x400 +
                                lVar26) >> 0xb);
    local_1c0[7] = (int)((ulong)(lVar21 * 0x4560 + lVar25 + lVar24 * 0x2218 + lVar29 + 0x400 +
                                lVar30) >> 0xb);
    piVar22 = local_138;
    if ((int)lVar27 != 7) {
      if ((int)lVar27 == 0xf) {
        lVar27 = 0;
        for (iVar19 = 7; -1 < iVar19; iVar19 = iVar19 + -1) {
          iVar1 = *(int *)((long)aiStack_58 + lVar27);
          iVar2 = *(int *)((long)data + lVar27);
          iVar3 = *(int *)((long)data + lVar27 + 0x20);
          lVar36 = (long)(iVar1 + iVar2);
          iVar4 = *(int *)((long)aiStack_78 + lVar27);
          lVar32 = (long)(iVar4 + iVar3);
          iVar5 = *(int *)((long)data + lVar27 + 0x40);
          iVar6 = *(int *)((long)aiStack_98 + lVar27);
          iVar7 = *(int *)((long)data + lVar27 + 0xc0);
          iVar8 = *(int *)((long)local_138 + lVar27);
          iVar9 = *(int *)((long)aiStack_118 + lVar27);
          lVar28 = (long)(iVar9 + iVar7);
          iVar10 = *(int *)((long)data + lVar27 + 0xe0);
          lVar26 = (long)(iVar10 + iVar8);
          lVar25 = lVar26 + lVar36;
          lVar36 = lVar36 - lVar26;
          lVar26 = lVar28 + lVar32;
          lVar32 = lVar32 - lVar28;
          lVar41 = (long)(iVar6 + iVar5);
          iVar11 = *(int *)((long)data + lVar27 + 0xa0);
          iVar12 = *(int *)((long)aiStack_f8 + lVar27);
          lVar30 = (long)(iVar12 + iVar11);
          lVar28 = lVar30 + lVar41;
          lVar41 = lVar41 - lVar30;
          iVar13 = *(int *)((long)data + lVar27 + 0x60);
          iVar14 = *(int *)((long)aiStack_b8 + lVar27);
          lVar37 = (long)(iVar14 + iVar13);
          iVar15 = *(int *)((long)data + lVar27 + 0x80);
          iVar16 = *(int *)((long)aiStack_d8 + lVar27);
          lVar23 = (long)(iVar16 + iVar15);
          lVar30 = lVar23 + lVar37;
          lVar37 = lVar37 - lVar23;
          *(int *)((long)data + lVar27) = (int)(lVar30 + lVar28 + lVar26 + lVar25 + 8U >> 4);
          lVar23 = (long)(iVar2 - iVar1);
          lVar33 = (long)(iVar3 - iVar4);
          lVar21 = (long)(iVar5 - iVar6);
          lVar24 = (long)(iVar13 - iVar14);
          lVar29 = (long)(iVar15 - iVar16);
          lVar38 = (long)(iVar11 - iVar12);
          lVar40 = (long)(iVar7 - iVar9);
          lVar31 = (long)(iVar10 - iVar8);
          *(int *)((long)data + lVar27 + 0x80) =
               (int)((lVar26 - lVar28) * 0x1151 + (lVar25 - lVar30) * 0x29cf + 0x10000U >> 0x11);
          lVar25 = (lVar36 - lVar41) * 0x2c63 + (lVar37 - lVar32) * 0x8d4;
          *(int *)((long)data + lVar27 + 0x40) =
               (int)((ulong)(lVar41 * 0x4587 + lVar25 + 0x10000 + lVar32 * 0x2e75) >> 0x11);
          *(int *)((long)data + lVar27 + 0xc0) =
               (int)((ulong)(lVar37 * 0x1ffffffffde07 + lVar25 + 0x10000 + lVar36 * 0x1fffffffff93e)
                    >> 0x11);
          lVar30 = (lVar40 - lVar31) * 0xd23 + (lVar33 + lVar23) * 0x2b4e;
          lVar25 = (lVar31 + lVar38) * 0x1555 + (lVar21 + lVar23) * 0x27e9;
          lVar36 = (lVar29 - lVar31) * 0x1cb6 + (lVar24 + lVar23) * 0x22fc;
          lVar28 = (lVar40 - lVar38) * 0x2d09 + (lVar21 + lVar33) * 0x470;
          lVar32 = (lVar40 + lVar29) * -0x27e9 + (lVar24 + lVar33) * -0x1555;
          lVar26 = (lVar38 - lVar29) * 0xd23 + (lVar24 + lVar21) * -0x2b4e;
          *(int *)((long)data + lVar27 + 0x20) =
               (int)(lVar31 * 0x18f3 + lVar23 * 0x1ffffffffb6d6 + lVar25 + lVar30 + lVar36 +
                     0x10000U >> 0x11);
          *(int *)((long)data + lVar27 + 0x60) =
               (int)(lVar30 + lVar28 + lVar40 * 0x1ffffffffcac1 + lVar33 * 0x24d + lVar32 + 0x10000U
                    >> 0x11);
          *(int *)((long)data + lVar27 + 0xa0) =
               (int)((ulong)(lVar38 * 0x2747 + lVar28 + lVar21 * -0x2406 + lVar26 + 0x10000 + lVar25
                            ) >> 0x11);
          *(int *)((long)data + lVar27 + 0xe0) =
               (int)((ulong)(lVar29 * 0x4560 + lVar32 + lVar24 * 0x2218 + lVar26 + 0x10000 + lVar36)
                    >> 0x11);
          lVar27 = lVar27 + 4;
        }
        return;
      }
      piVar22 = local_1c0 + 8;
    }
    lVar27 = lVar27 + 1;
    local_1c0 = piVar22;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_16x16 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  DCTELEM workspace[DCTSIZE2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/32). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) + GETJSAMPLE(elemptr[8]);

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) - GETJSAMPLE(elemptr[8]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 + tmp13 - 16 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS-PASS1_BITS);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == DCTSIZE * 2)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/16)**2 = 1/2**2.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] + wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] + wsptr[DCTSIZE*0];

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] - wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] - wsptr[DCTSIZE*0];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(tmp10 + tmp11 + tmp12 + tmp13, PASS1_BITS+2);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS+PASS1_BITS+2);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+10 */
	      CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS+PASS1_BITS+2);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+PASS1_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}